

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_statemach_act(connectdata *conn)

{
  anon_union_240_10_26c073a1_for_proto *pp_00;
  curl_socket_t sockfd;
  curl_usessl cVar1;
  int *piVar2;
  imapstate iVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  uint uVar7;
  CURLcode CVar8;
  curl_ftpfile cVar9;
  size_t sVar10;
  char *__dest;
  long lVar11;
  char *pcVar12;
  Curl_easy *pCVar13;
  size_t sVar14;
  size_t maxlen;
  pingpong *pp;
  size_t __n;
  byte *pbVar15;
  saslprogress local_58;
  undefined4 uStack_54;
  int pop3code;
  Curl_easy *local_48;
  SASL *local_40;
  size_t nread;
  
  sockfd = conn->sock[0];
  nread = 0;
  if ((conn->proto).imapc.state == IMAP_UPGRADETLS) {
    CVar5 = pop3_perform_upgrade_tls(conn);
    return CVar5;
  }
  pp_00 = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar5 = Curl_pp_flushsend(&(pp_00->ftpc).pp);
    return CVar5;
  }
  local_40 = (SASL *)&(conn->proto).imapc.sasl.prefmech;
  do {
    CVar5 = Curl_pp_readresp(sockfd,&(pp_00->ftpc).pp,&pop3code,&nread);
    iVar6 = pop3code;
    if (CVar5 != CURLE_OK) {
      return CVar5;
    }
    if (pop3code == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).imapc.state) {
    case IMAP_SERVERGREET:
      local_48 = conn->data;
      pcVar12 = (local_48->state).buffer;
      sVar10 = strlen(pcVar12);
      if (iVar6 != 0x2b) {
        Curl_failf(local_48,"Got unexpected pop3-server response");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if ((3 < sVar10) && (pcVar12[sVar10 - 2] == '>')) {
        __n = sVar10 - 4;
        for (lVar11 = 4; lVar11 - 1U < sVar10 - 2; lVar11 = lVar11 + 1) {
          if (pcVar12[lVar11 + -1] == '<') {
            if (__n != 0) {
              __dest = (char *)(*Curl_ccalloc)(1,__n + 1);
              (conn->proto).imapc.mailbox_uidvalidity = __dest;
              if (__dest != (char *)0x0) {
                memcpy(__dest,pcVar12 + lVar11 + -1,__n);
                (conn->proto).imapc.mailbox_uidvalidity[__n] = '\0';
                pbVar15 = (byte *)((long)&conn->proto + 0xa8);
                *pbVar15 = *pbVar15 | 2;
              }
            }
            break;
          }
          __n = __n - 1;
        }
      }
      CVar8 = pop3_perform_capa(conn);
      break;
    case IMAP_CAPABILITY:
      pCVar13 = conn->data;
      piVar2 = (int *)(pCVar13->state).buffer;
      sVar10 = strlen((char *)piVar2);
      if (iVar6 == 0x2b) {
        cVar1 = (pCVar13->set).use_ssl;
        if ((cVar1 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
          if ((conn->proto).pop3c.tls_supported == true) {
            CVar5 = Curl_pp_sendf(&(pp_00->ftpc).pp,"%s","STLS");
            iVar3 = IMAP_STARTTLS;
            goto LAB_00131b42;
          }
          if (cVar1 != CURLUSESSL_TRY) {
            pcVar12 = "STLS not supported.";
            goto LAB_00131f00;
          }
        }
LAB_00131e5c:
        CVar8 = pop3_perform_authentication(conn);
        break;
      }
      if (iVar6 != 0x2a) {
        pbVar15 = (byte *)((long)&conn->proto + 0xa8);
        *pbVar15 = *pbVar15 | 1;
        goto LAB_00131e5c;
      }
      if (3 < sVar10) {
        if (*piVar2 == 0x534c5453) {
          (conn->proto).pop3c.tls_supported = true;
        }
        else if (*piVar2 == 0x52455355) {
          pbVar15 = (byte *)((long)&conn->proto + 0xa8);
          *pbVar15 = *pbVar15 | 1;
        }
        else if ((sVar10 != 4) && (iVar6 = bcmp(piVar2,"SASL ",5), iVar6 == 0)) {
          pbVar15 = (byte *)((long)&conn->proto + 0xa8);
          *pbVar15 = *pbVar15 | 4;
          pbVar15 = (byte *)((long)piVar2 + 5);
          lVar11 = sVar10 - 5;
          do {
            lVar11 = -lVar11;
            while( true ) {
              if (lVar11 == 0) goto LAB_00131e6d;
              if ((0x20 < (ulong)*pbVar15) || ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) == 0))
              break;
              pbVar15 = pbVar15 + 1;
              lVar11 = lVar11 + 1;
            }
            sVar14 = 0;
            while ((maxlen = -lVar11, lVar11 + sVar14 != 0 &&
                   ((0x20 < (ulong)pbVar15[sVar14] ||
                    (maxlen = sVar14, (0x100002600U >> ((ulong)pbVar15[sVar14] & 0x3f) & 1) == 0))))
                  ) {
              sVar14 = sVar14 + 1;
            }
            uVar7 = Curl_sasl_decode_mech((char *)pbVar15,maxlen,(size_t *)&local_58);
            if ((uVar7 != 0) && (CONCAT44(uStack_54,local_58) == maxlen)) {
              piVar2 = &(conn->proto).ftpc.cwdcount;
              *piVar2 = *piVar2 | uVar7;
            }
            pbVar15 = pbVar15 + maxlen;
            lVar11 = -(lVar11 + maxlen);
          } while( true );
        }
      }
      goto LAB_00131e6d;
    case IMAP_STARTTLS:
      if (pop3code != 0x2b) {
        pCVar13 = conn->data;
        if ((pCVar13->set).use_ssl != CURLUSESSL_TRY) {
          pcVar12 = "STARTTLS denied";
LAB_00131f00:
          Curl_failf(pCVar13,pcVar12);
          return CURLE_USE_SSL_FAILED;
        }
        goto LAB_00131e5c;
      }
      CVar8 = pop3_perform_upgrade_tls(conn);
      break;
    default:
switchD_00131a8d_caseD_4:
      (conn->proto).imapc.state = IMAP_STOP;
      return CURLE_OK;
    case IMAP_AUTHENTICATE:
      pCVar13 = conn->data;
      CVar8 = Curl_sasl_continue(local_40,conn,pop3code,&local_58);
      if (CVar8 == CURLE_OK) {
        if (local_58 == SASL_IDLE) {
          cVar9 = (conn->proto).pop3c.preftype & (conn->proto).ftpc.prevmethod;
          if ((cVar9 & FTPFILE_NOCWD) == 0) {
            if ((cVar9 & FTPFILE_MULTICWD) == 0) {
              Curl_failf(pCVar13,"Authentication cancelled");
              CVar8 = CURLE_LOGIN_DENIED;
            }
            else {
              CVar8 = pop3_perform_user(conn);
            }
          }
          else {
            CVar8 = pop3_perform_apop(conn);
          }
        }
        else {
          CVar8 = CURLE_OK;
          CVar5 = CURLE_OK;
          if (local_58 == SASL_DONE) goto LAB_00131d43;
        }
      }
      break;
    case IMAP_LOGIN:
      if (pop3code == 0x2b) goto switchD_00131a8d_caseD_4;
      pCVar13 = conn->data;
      pcVar12 = "Authentication failed: %d";
      goto LAB_00131eeb;
    case IMAP_LIST:
      if (pop3code != 0x2b) goto LAB_00131eac;
      pcVar12 = conn->passwd;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      CVar5 = Curl_pp_sendf(&(pp_00->ftpc).pp,"PASS %s",pcVar12);
      iVar3 = IMAP_SELECT;
LAB_00131b42:
      if (CVar5 != CURLE_OK) {
        return CVar5;
      }
      (conn->proto).imapc.state = iVar3;
      goto LAB_00131e76;
    case IMAP_SELECT:
      if (pop3code == 0x2b) goto switchD_00131a8d_caseD_4;
LAB_00131eac:
      pCVar13 = conn->data;
      pcVar12 = "Access denied. %c";
LAB_00131eeb:
      Curl_failf(pCVar13,pcVar12,(ulong)(uint)pop3code);
      return CURLE_LOGIN_DENIED;
    case IMAP_FETCH:
      CVar5 = CURLE_RECV_ERROR;
      if (pop3code == 0x2b) {
        pCVar13 = conn->data;
        piVar2 = (int *)(pCVar13->req).protop;
        (conn->proto).pop3c.eob = 2;
        (conn->proto).pop3c.strip = 2;
        CVar5 = CURLE_OK;
        if (*piVar2 == 0) {
          Curl_setup_transfer(conn,0,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
          pcVar12 = (conn->proto).ftpc.pp.cache;
          CVar5 = CURLE_OK;
          if (pcVar12 != (char *)0x0) {
            if ((pCVar13->set).opt_no_body == false) {
              CVar5 = Curl_pop3_write(conn,pcVar12,(conn->proto).rtspc.rtp_bufsize);
              if (CVar5 != CURLE_OK) {
                return CVar5;
              }
              pcVar12 = (pp_00->ftpc).pp.cache;
            }
            (*Curl_cfree)(pcVar12);
            (pp_00->ftpc).pp.cache = (char *)0x0;
            (conn->proto).ftpc.pp.cache_size = 0;
            CVar5 = CURLE_OK;
          }
        }
      }
LAB_00131d43:
      CVar8 = CVar5;
      (conn->proto).imapc.state = IMAP_STOP;
    }
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
LAB_00131e6d:
    if ((conn->proto).imapc.state == IMAP_STOP) {
      return CURLE_OK;
    }
LAB_00131e76:
    _Var4 = Curl_pp_moredata(&(pp_00->ftpc).pp);
    if (!_Var4) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode pop3_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

 do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &pop3code, &nread);
    if(result)
      return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(conn, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_CRYPTO_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(conn, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(conn, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}